

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minicrypto.c
# Opt level: O2

void test_hrr(void)

{
  ptls_key_exchange_algorithm_t *ppVar1;
  uint __line;
  int iVar2;
  ptls_t *tls;
  ptls_t *tls_00;
  char *__assertion;
  size_t consumed;
  ptls_buffer_t cbuf;
  ptls_buffer_t decbuf;
  ptls_buffer_t sbuf;
  ptls_key_exchange_algorithm_t *client_keyex [3];
  ptls_context_t local_c100;
  uint8_t decbuf_small [16384];
  uint8_t sbuf_small [16384];
  uint8_t cbuf_small [16384];
  
  client_keyex[2] = (ptls_key_exchange_algorithm_t *)0x0;
  client_keyex[0] = &ptls_minicrypto_x25519;
  client_keyex[1] = &ptls_minicrypto_secp256r1;
  memset(&local_c100.certificates,0,0xa8);
  local_c100.random_bytes = ptls_minicrypto_random_bytes;
  local_c100.get_time = &ptls_get_time;
  local_c100.cipher_suites = ptls_minicrypto_cipher_suites;
  ppVar1 = *ctx_peer->key_exchanges;
  local_c100.key_exchanges = client_keyex;
  if ((ppVar1 == (ptls_key_exchange_algorithm_t *)0x0) || (ppVar1->id != 0x17)) {
    __assertion = 
    "ctx_peer->key_exchanges[0] != NULL && ctx_peer->key_exchanges[0]->id == PTLS_GROUP_SECP256R1";
    __line = 0x4c;
  }
  else {
    if (ctx_peer->key_exchanges[1] == (ptls_key_exchange_algorithm_t *)0x0) {
      tls = ptls_new(&local_c100,0);
      tls_00 = ptls_new(ctx_peer,1);
      cbuf.base = cbuf_small;
      cbuf.off = 0;
      cbuf.capacity = 0x4000;
      cbuf.is_allocated = 0;
      sbuf.base = sbuf_small;
      sbuf.off = 0;
      sbuf.capacity = 0x4000;
      sbuf.is_allocated = 0;
      decbuf.base = decbuf_small;
      decbuf.off = 0;
      decbuf.capacity = 0x4000;
      decbuf.is_allocated = 0;
      iVar2 = ptls_handshake(tls,&cbuf,(void *)0x0,(size_t *)0x0,(ptls_handshake_properties_t *)0x0)
      ;
      _ok((uint)(iVar2 == 0x202),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x56)
      ;
      consumed = cbuf.off;
      iVar2 = ptls_handshake(tls_00,&sbuf,cbuf.base,&consumed,(ptls_handshake_properties_t *)0x0);
      _ok((uint)(iVar2 == 0x202),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x5a)
      ;
      _ok((uint)(consumed == cbuf.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x5b)
      ;
      cbuf.off = 0;
      _ok((uint)(9 < sbuf.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x5e)
      ;
      _ok((uint)(sbuf.base[5] == '\x02'),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x5f)
      ;
      consumed = sbuf.off;
      iVar2 = ptls_handshake(tls,&cbuf,sbuf.base,&consumed,(ptls_handshake_properties_t *)0x0);
      _ok((uint)(iVar2 == 0x202),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",99);
      _ok((uint)(consumed == sbuf.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",100);
      sbuf.off = 0;
      _ok((uint)(8 < cbuf.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x67)
      ;
      _ok((uint)(cbuf.base[5] == '\x01'),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x68)
      ;
      consumed = cbuf.off;
      while( true ) {
        iVar2 = ptls_handshake(tls_00,&sbuf,cbuf.base,&consumed,(ptls_handshake_properties_t *)0x0);
        if (iVar2 != 0x202) break;
        usleep(100);
      }
      _ok((uint)(iVar2 == 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x72)
      ;
      _ok((uint)(consumed == cbuf.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x73)
      ;
      cbuf.off = 0;
      _ok((uint)(8 < sbuf.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x76)
      ;
      _ok((uint)(sbuf.base[5] == '\x02'),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x77)
      ;
      consumed = sbuf.off;
      iVar2 = ptls_handshake(tls,&cbuf,sbuf.base,&consumed,(ptls_handshake_properties_t *)0x0);
      _ok((uint)(iVar2 == 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x7b)
      ;
      _ok((uint)(consumed == sbuf.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x7c)
      ;
      sbuf.off = 0;
      iVar2 = ptls_send(tls,&cbuf,"hello world",0xb);
      _ok((uint)(iVar2 == 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x80)
      ;
      consumed = cbuf.off;
      iVar2 = ptls_receive(tls_00,&decbuf,cbuf.base,&consumed);
      _ok((uint)(iVar2 == 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x84)
      ;
      _ok((uint)(consumed == cbuf.off),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x85)
      ;
      cbuf.off = 0;
      _ok((uint)(decbuf.off == 0xb),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x88)
      ;
      iVar2 = bcmp(decbuf.base,"hello world",0xb);
      _ok((uint)(iVar2 == 0),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x89)
      ;
      ptls_buffer_dispose(&decbuf);
      ptls_buffer_dispose(&sbuf);
      ptls_buffer_dispose(&cbuf);
      ptls_free(tls);
      ptls_free(tls_00);
      return;
    }
    __assertion = "ctx_peer->key_exchanges[1] == NULL";
    __line = 0x4d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c"
                ,__line,"void test_hrr(void)");
}

Assistant:

static void test_hrr(void)
{
    ptls_key_exchange_algorithm_t *client_keyex[] = {&ptls_minicrypto_x25519, &ptls_minicrypto_secp256r1, NULL};
    ptls_context_t client_ctx = {ptls_minicrypto_random_bytes, &ptls_get_time, client_keyex, ptls_minicrypto_cipher_suites};
    ptls_t *client, *server;
    ptls_buffer_t cbuf, sbuf, decbuf;
    uint8_t cbuf_small[16384], sbuf_small[16384], decbuf_small[16384];
    size_t consumed;
    int ret;

    assert(ctx_peer->key_exchanges[0] != NULL && ctx_peer->key_exchanges[0]->id == PTLS_GROUP_SECP256R1);
    assert(ctx_peer->key_exchanges[1] == NULL);

    client = ptls_new(&client_ctx, 0);
    server = ptls_new(ctx_peer, 1);
    ptls_buffer_init(&cbuf, cbuf_small, sizeof(cbuf_small));
    ptls_buffer_init(&sbuf, sbuf_small, sizeof(sbuf_small));
    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    ret = ptls_handshake(client, &cbuf, NULL, NULL, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);

    consumed = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(consumed == cbuf.off);
    cbuf.off = 0;

    ok(sbuf.off > 5 + 4);
    ok(sbuf.base[5] == 2 /* PTLS_HANDSHAKE_TYPE_SERVER_HELLO (RETRY_REQUEST) */);

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(consumed == sbuf.off);
    sbuf.off = 0;

    ok(cbuf.off >= 5 + 4);
    ok(cbuf.base[5] == 1 /* PTLS_HANDSHAKE_TYPE_CLIENT_HELLO */);

    consumed = cbuf.off;
    do
    {
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
        if (ret == PTLS_ERROR_IN_PROGRESS)
            usleep(100);
    }
    while (ret == PTLS_ERROR_IN_PROGRESS);
    ok(ret == 0);
    ok(consumed == cbuf.off);
    cbuf.off = 0;

    ok(sbuf.off >= 5 + 4);
    ok(sbuf.base[5] == 2 /* PTLS_HANDSHAKE_TYPE_SERVER_HELLO */);

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(consumed == sbuf.off);
    sbuf.off = 0;

    ret = ptls_send(client, &cbuf, "hello world", 11);
    ok(ret == 0);

    consumed = cbuf.off;
    ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
    ok(ret == 0);
    ok(consumed == cbuf.off);
    cbuf.off = 0;

    ok(decbuf.off == 11);
    ok(memcmp(decbuf.base, "hello world", 11) == 0);

    ptls_buffer_dispose(&decbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&cbuf);
    ptls_free(client);
    ptls_free(server);
}